

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdtFunc.h
# Opt level: O0

char * SDT::newtemp_abi_cxx11_(void)

{
  char *in_RDI;
  __cxx11 local_30 [40];
  
  cntTemp = cntTemp + 1;
  std::__cxx11::to_string(local_30,cntTemp);
  std::operator+(in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"_t");
  std::__cxx11::string::~string((string *)local_30);
  return in_RDI;
}

Assistant:

string newtemp(){
        return "_t"+to_string(++cntTemp);
    }